

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::insert_verilator_public(Generator *top)

{
  undefined1 local_58 [8];
  InsertVerilatorPublic visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  InsertVerilatorPublic::InsertVerilatorPublic((InsertVerilatorPublic *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  InsertVerilatorPublic::~InsertVerilatorPublic((InsertVerilatorPublic *)local_58);
  return;
}

Assistant:

void insert_verilator_public(Generator *top) {
    InsertVerilatorPublic visitor;
    visitor.visit_generator_root_p(top);
}